

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O2

void __thiscall TestOutput::printCurrentTestEnded(TestOutput *this,TestResult *res)

{
  size_t sVar1;
  
  if (0 < (int)this->verbose_) {
    (*this->_vptr_TestOutput[0xb])(this," - ");
    sVar1 = TestResult::getCurrentTestTotalExecutionTime(res);
    (*this->_vptr_TestOutput[0xd])(this,sVar1);
    (*this->_vptr_TestOutput[0xb])(this," ms\n");
    return;
  }
  (*this->_vptr_TestOutput[0x16])(this);
  return;
}

Assistant:

void TestOutput::printCurrentTestEnded(const TestResult& res)
{
    if (verbose_ > level_quiet) {
        print(" - ");
        print(res.getCurrentTestTotalExecutionTime());
        print(" ms\n");
    }
    else {
        printProgressIndicator();
    }
}